

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O0

bool r_exec::dis(Context *context,uint16_t *index)

{
  byte bVar1;
  char cVar2;
  uint16_t uVar3;
  Atom *pAVar4;
  long lVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  double dVar9;
  undefined1 auVar10 [16];
  Atom local_8c [4];
  long local_88;
  uint64_t rhs_t;
  uint64_t lhs_t;
  Context local_70;
  undefined1 local_60 [8];
  Context rhs;
  Context local_40;
  undefined1 local_30 [8];
  Context lhs;
  uint16_t *index_local;
  Context *context_local;
  
  lhs.implementation = (_Context *)index;
  Context::getChild(&local_40,(uint16_t)context);
  Context::operator*((Context *)local_30);
  Context::~Context(&local_40);
  Context::getChild(&local_70,(uint16_t)context);
  Context::operator*((Context *)local_60);
  Context::~Context(&local_70);
  Context::operator[]((Context *)local_30,0);
  bVar1 = r_code::Atom::isFloat();
  if ((bVar1 & 1) == 0) {
    Context::operator[]((Context *)local_30,0);
    cVar2 = r_code::Atom::getDescriptor();
    if (cVar2 == -0x39) {
      Context::operator[]((Context *)local_60,0);
      cVar2 = r_code::Atom::getDescriptor();
      if (cVar2 == -0x39) {
        pAVar4 = Context::operator[]((Context *)local_30,0);
        rhs_t = r_code::Utils::GetTimestamp(pAVar4);
        pAVar4 = Context::operator[]((Context *)local_60,0);
        local_88 = r_code::Utils::GetTimestamp(pAVar4);
        lVar5 = rhs_t - local_88;
        auVar10._8_4_ = (int)((ulong)lVar5 >> 0x20);
        auVar10._0_8_ = lVar5;
        auVar10._12_4_ = 0x45300000;
        dVar9 = ABS((auVar10._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0));
        uVar6 = (ulong)dVar9;
        uVar3 = Context::setTimestampResult
                          (context,uVar6 | (long)(dVar9 - 9.223372036854776e+18) &
                                           (long)uVar6 >> 0x3f);
        *(uint16_t *)&(lhs.implementation)->_vptr__Context = uVar3;
        context_local._7_1_ = true;
        goto LAB_00284ba5;
      }
    }
  }
  else {
    Context::operator[]((Context *)local_60,0);
    bVar1 = r_code::Atom::isFloat();
    if ((bVar1 & 1) != 0) {
      Context::operator[]((Context *)local_30,0);
      fVar7 = (float)r_code::Atom::asFloat();
      Context::operator[]((Context *)local_60,0);
      fVar8 = (float)r_code::Atom::asFloat();
      dVar9 = std::fabs((double)(ulong)(uint)(fVar7 - fVar8));
      r_code::Atom::Float(SUB84(dVar9,0));
      uVar3 = Context::setAtomicResult(context,(Atom *)((long)&lhs_t + 4));
      *(uint16_t *)&(lhs.implementation)->_vptr__Context = uVar3;
      r_code::Atom::~Atom((Atom *)((long)&lhs_t + 4));
      context_local._7_1_ = true;
      goto LAB_00284ba5;
    }
  }
  r_code::Atom::Nil();
  uVar3 = Context::setAtomicResult(context,local_8c);
  *(uint16_t *)&(lhs.implementation)->_vptr__Context = uVar3;
  r_code::Atom::~Atom(local_8c);
  context_local._7_1_ = false;
LAB_00284ba5:
  lhs_t._0_4_ = 1;
  Context::~Context((Context *)local_60);
  Context::~Context((Context *)local_30);
  return context_local._7_1_;
}

Assistant:

bool dis(const Context &context, uint16_t &index)
{
    Context lhs = *context.getChild(1);
    Context rhs = *context.getChild(2);

    if (lhs[0].isFloat()) {
        if (rhs[0].isFloat()) {
            index = context.setAtomicResult(Atom::Float(fabs(lhs[0].asFloat() - rhs[0].asFloat())));
            return true;
        }
    } else if (lhs[0].getDescriptor() == Atom::TIMESTAMP) {
        if (rhs[0].getDescriptor() == Atom::TIMESTAMP) {
            uint64_t lhs_t = Utils::GetTimestamp(&lhs[0]);
            uint64_t rhs_t = Utils::GetTimestamp(&rhs[0]);
            index = context.setTimestampResult(fabs((double)(lhs_t - rhs_t)));
            return true;
        }
    }

    index = context.setAtomicResult(Atom::Nil());
    return false;
}